

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int big2_predefinedEntityName(ENCODING *enc,char *ptr,char *end)

{
  int iVar1;
  long lVar2;
  int iVar3;
  
  lVar2 = ((long)end - (long)ptr) / 2;
  if (lVar2 == 4) {
    if (*ptr == '\0') {
      if (ptr[1] == 'a') {
        if ((((ptr[2] == '\0') && (ptr[3] == 'p')) && (ptr[4] == '\0')) &&
           (((ptr[5] == 'o' && (ptr[6] == '\0')) && (ptr[7] == 's')))) {
          return 0x27;
        }
      }
      else if (((ptr[1] == 'q') && (ptr[2] == '\0')) &&
              (((ptr[3] == 'u' && (((ptr[4] == '\0' && (ptr[5] == 'o')) && (ptr[6] == '\0')))) &&
               (ptr[7] == 't')))) {
        return 0x22;
      }
    }
  }
  else if (lVar2 == 3) {
    if (((*ptr == '\0') && (ptr[1] == 'a')) &&
       (((ptr[2] == '\0' && ((ptr[3] == 'm' && (ptr[4] == '\0')))) && (ptr[5] == 'p')))) {
      return 0x26;
    }
  }
  else if (((lVar2 == 2) && (ptr[2] == '\0')) && (ptr[3] == 't')) {
    if (*ptr != '\0') {
      return 0;
    }
    iVar3 = 0x3e;
    if (ptr[1] != 'g') {
      iVar3 = 0;
    }
    iVar1 = 0x3c;
    if (ptr[1] != 'l') {
      iVar1 = iVar3;
    }
    return iVar1;
  }
  return 0;
}

Assistant:

static
int PREFIX(predefinedEntityName)(const ENCODING *enc, const char *ptr, const char *end)
{
  cmExpatUnused(enc);
  switch ((end - ptr)/MINBPC(enc)) {
  case 2:
    if (CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_t)) {
      switch (BYTE_TO_ASCII(enc, ptr)) {
      case ASCII_l:
        return ASCII_LT;
      case ASCII_g:
        return ASCII_GT;
      }
    }
    break;
  case 3:
    if (CHAR_MATCHES(enc, ptr, ASCII_a)) {
      ptr += MINBPC(enc);
      if (CHAR_MATCHES(enc, ptr, ASCII_m)) {
        ptr += MINBPC(enc);
        if (CHAR_MATCHES(enc, ptr, ASCII_p))
          return ASCII_AMP;
      }
    }
    break;
  case 4:
    switch (BYTE_TO_ASCII(enc, ptr)) {
    case ASCII_q:
      ptr += MINBPC(enc);
      if (CHAR_MATCHES(enc, ptr, ASCII_u)) {
        ptr += MINBPC(enc);
        if (CHAR_MATCHES(enc, ptr, ASCII_o)) {
          ptr += MINBPC(enc);
          if (CHAR_MATCHES(enc, ptr, ASCII_t))
            return ASCII_QUOT;
        }
      }
      break;
    case ASCII_a:
      ptr += MINBPC(enc);
      if (CHAR_MATCHES(enc, ptr, ASCII_p)) {
        ptr += MINBPC(enc);
        if (CHAR_MATCHES(enc, ptr, ASCII_o)) {
          ptr += MINBPC(enc);
          if (CHAR_MATCHES(enc, ptr, ASCII_s))
            return ASCII_APOS;
        }
      }
      break;
    }
  }
  return 0;
}